

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O0

UBool __thiscall icu_63::AnnualTimeZoneRule::operator==(AnnualTimeZoneRule *this,TimeZoneRule *that)

{
  bool bVar1;
  UBool UVar2;
  bool local_31;
  AnnualTimeZoneRule *atzr;
  TimeZoneRule *that_local;
  AnnualTimeZoneRule *this_local;
  
  if (this == (AnnualTimeZoneRule *)that) {
    this_local._7_1_ = true;
  }
  else {
    if (this == (AnnualTimeZoneRule *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator!=
                      ((type_info *)(this->super_TimeZoneRule).super_UObject._vptr_UObject[-1],
                       (type_info *)(that->super_UObject)._vptr_UObject[-1]);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      UVar2 = DateTimeRule::operator==
                        (this->fDateTimeRule,(DateTimeRule *)that[1].super_UObject._vptr_UObject);
      local_31 = false;
      if ((UVar2 != '\0') &&
         (local_31 = false,
         this->fStartYear == *(int *)&that[1].fName.super_Replaceable.super_UObject._vptr_UObject))
      {
        local_31 = this->fEndYear ==
                   *(int *)((long)&that[1].fName.super_Replaceable.super_UObject._vptr_UObject + 4);
      }
      this_local._7_1_ = local_31;
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
AnnualTimeZoneRule::operator==(const TimeZoneRule& that) const {
    if (this == &that) {
        return TRUE;
    }
    if (typeid(*this) != typeid(that)) {
        return FALSE;
    }
    AnnualTimeZoneRule *atzr = (AnnualTimeZoneRule*)&that;
    return (*fDateTimeRule == *(atzr->fDateTimeRule) &&
            fStartYear == atzr->fStartYear &&
            fEndYear == atzr->fEndYear);
}